

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::removeOrder(PatternModel *this)

{
  int a;
  OrderRemoveCmd *this_00;
  QUndoStack *pQVar1;
  QLatin1Char local_5b;
  QChar local_5a;
  QString local_58;
  QString local_40;
  OrderRemoveCmd *local_18;
  OrderRemoveCmd *cmd;
  PatternModel *this_local;
  
  cmd = (OrderRemoveCmd *)this;
  this_00 = (OrderRemoveCmd *)operator_new(0x20);
  OrderRemoveCmd::OrderRemoveCmd(this_00,this,this->mCursorPattern);
  local_18 = this_00;
  tr(&local_58,"remove order #%1",(char *)0x0,-1);
  a = this->mCursorPattern;
  QLatin1Char::QLatin1Char(&local_5b,' ');
  QChar::QChar(&local_5a,local_5b);
  QString::arg(&local_40,&local_58,a,0,10,local_5a);
  QUndoCommand::setText((QString *)this_00);
  QString::~QString(&local_40);
  QString::~QString(&local_58);
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::removeOrder() {
    auto cmd = new OrderRemoveCmd(*this, mCursorPattern);
    cmd->setText(tr("remove order #%1").arg(mCursorPattern));
    mModule.undoStack()->push(cmd);
}